

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TheoryAxioms.cpp
# Opt level: O3

void __thiscall Shell::TheoryAxioms::addAcyclicityAxiom(TheoryAxioms *this,TermAlgebra *ta)

{
  byte bVar1;
  bool bVar2;
  uint subtermPredicate;
  uint uVar3;
  ulong uVar4;
  uint64_t uVar5;
  byte bVar6;
  initializer_list<Kernel::Literal_*> lits;
  Stack<Kernel::TermList> local_58;
  Literal *local_38;
  
  subtermPredicate = TermAlgebra::getSubtermPredicate(ta);
  if (ta->_allowsCyclicTerms != false) {
    return;
  }
  if (ta->_n == 0) {
    return;
  }
  uVar4 = 0;
  bVar1 = 0;
  do {
    bVar6 = bVar1;
    if ((ta->_constrs)._capacity <= uVar4) {
      Lib::Array<Shell::TermAlgebraConstructor_*>::expandToFit(&ta->_constrs,uVar4);
    }
    bVar2 = addSubtermDefinitions(this,subtermPredicate,(ta->_constrs)._array[uVar4]);
    uVar4 = uVar4 + 1;
    bVar1 = bVar6 | bVar2;
  } while (uVar4 < ta->_n);
  if (bVar6 == 0 && !bVar2) {
    return;
  }
  local_58._cursor = (TermList *)0x0;
  local_58._end = (TermList *)0x0;
  local_58._capacity = 0;
  local_58._stack = (TermList *)0x0;
  if ((*(uint *)((ta->_sort)._content + 0xc) & 0xfffffff) == 0) {
    uVar4 = 1;
  }
  else {
    uVar5 = 1;
    uVar4 = 0;
    do {
      if (local_58._cursor == local_58._end) {
        Lib::Stack<Kernel::TermList>::expand(&local_58);
      }
      (local_58._cursor)->_content = uVar5;
      local_58._cursor = local_58._cursor + 1;
      uVar4 = uVar4 + 1;
      uVar3 = *(uint *)((ta->_sort)._content + 0xc) & 0xfffffff;
      uVar5 = uVar5 + 4;
    } while (uVar4 < uVar3);
    uVar4 = (ulong)(uVar3 * 4 + 1);
    if (local_58._cursor != local_58._end) goto LAB_007d491e;
  }
  Lib::Stack<Kernel::TermList>::expand(&local_58);
LAB_007d491e:
  (local_58._cursor)->_content = uVar4;
  local_58._cursor = local_58._cursor + 1;
  uVar3 = *(uint *)((ta->_sort)._content + 0xc);
  if (local_58._cursor == local_58._end) {
    Lib::Stack<Kernel::TermList>::expand(&local_58);
  }
  (local_58._cursor)->_content = (ulong)(uVar3 & 0xfffffff) * 4 + 1;
  local_58._cursor = local_58._cursor + 1;
  local_38 = Kernel::Literal::create
                       (subtermPredicate,(*(uint *)((ta->_sort)._content + 0xc) & 0xfffffff) + 2,
                        false,local_58._stack);
  lits._M_len = 1;
  lits._M_array = &local_38;
  addTheoryClauseFromLits(this,lits,TERM_ALGEBRA_ACYCLICITY_AXIOM,0);
  if (local_58._stack != (TermList *)0x0) {
    uVar4 = local_58._capacity * 8 + 0xf & 0xfffffffffffffff0;
    if (uVar4 == 0) {
      (local_58._stack)->_content = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_58._stack;
    }
    else if (uVar4 < 0x11) {
      (local_58._stack)->_content = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = local_58._stack;
    }
    else if (uVar4 < 0x19) {
      (local_58._stack)->_content = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = local_58._stack;
    }
    else if (uVar4 < 0x21) {
      (local_58._stack)->_content = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_58._stack;
    }
    else if (uVar4 < 0x31) {
      (local_58._stack)->_content = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_58._stack;
    }
    else if (uVar4 < 0x41) {
      (local_58._stack)->_content = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_58._stack;
    }
    else {
      operator_delete(local_58._stack,0x10);
    }
  }
  return;
}

Assistant:

void TheoryAxioms::addAcyclicityAxiom(TermAlgebra* ta)
{
  unsigned pred = ta->getSubtermPredicate();

  if (ta->allowsCyclicTerms()) {
    return;
  }

  bool rec = false;

  for (unsigned i = 0; i < ta->nConstructors(); i++) {
    if (addSubtermDefinitions(pred, ta->constructor(i))) {
      rec = true;
    }
  }

  // rec <=> the subterm relation is non-empty
  if (!rec) {
    return;
  }

  TermStack args;
  for (unsigned i = 0; i < ta->nTypeArgs(); i++) {
    args.push(TermList(i,false));
  }
  args.push(TermList(ta->nTypeArgs(),false));
  args.push(TermList(ta->nTypeArgs(),false));

  Literal* sub = Literal::create(pred, ta->nTypeArgs()+2, false, args.begin());
  addTheoryClauseFromLits({sub}, InferenceRule::TERM_ALGEBRA_ACYCLICITY_AXIOM,CHEAP);
}